

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

size_t __thiscall ThreadContext::GetStackLimitForCurrentThread(ThreadContext *this)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  sVar1 = this->stackLimitForCurrentThread;
  if (((sVar1 != 0x7fffffffffffffff) && (this->stackProber != (StackProber *)0x0)) &&
     (sVar1 != this->stackProber->stackLimit)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x638,
                       "(limit == Js::Constants::StackLimitForScriptInterrupt || !this->GetStackProber() || limit == this->GetStackProber()->GetScriptStackLimit())"
                       ,
                       "limit == Js::Constants::StackLimitForScriptInterrupt || !this->GetStackProber() || limit == this->GetStackProber()->GetScriptStackLimit()"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return sVar1;
}

Assistant:

size_t
 ThreadContext::GetStackLimitForCurrentThread() const
{
    FAULTINJECT_SCRIPT_TERMINATION;
    size_t limit = this->stackLimitForCurrentThread;
    Assert(limit == Js::Constants::StackLimitForScriptInterrupt
        || !this->GetStackProber()
        || limit == this->GetStackProber()->GetScriptStackLimit());
    return limit;
}